

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_0::HangingHttpService::request
          (HangingHttpService *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
          AsyncInputStream *requestBody,Response *responseSender)

{
  undefined4 in_register_00000034;
  HangingHttpService *pHVar1;
  Type local_58;
  undefined1 local_50 [16];
  Promise<void> result;
  HttpHeaders *headers_local;
  HttpMethod method_local;
  HangingHttpService *this_local;
  StringPtr url_local;
  
  pHVar1 = (HangingHttpService *)CONCAT44(in_register_00000034,method);
  result.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)requestBody;
  kj::_::NeverDone::operator_cast_to_Promise((NeverDone *)&stack0xffffffffffffffc0);
  pHVar1->inFlight = pHVar1->inFlight + 1;
  local_58.this = pHVar1;
  defer<kj::(anonymous_namespace)::HangingHttpService::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::AsyncInputStream&,kj::HttpService::Response&)::_lambda()_1_>
            ((kj *)local_50,&local_58);
  Promise<void>::
  attach<kj::_::Deferred<kj::(anonymous_namespace)::HangingHttpService::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::AsyncInputStream&,kj::HttpService::Response&)::_lambda()_1_>>
            ((Promise<void> *)this,
             (Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:4626:36)>
              *)&stack0xffffffffffffffc0);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:4626:36)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:4626:36)>
               *)local_50);
  Promise<void>::~Promise((Promise<void> *)&stack0xffffffffffffffc0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> request(
      HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
      kj::AsyncInputStream& requestBody, Response& responseSender) override {
    kj::Promise<void> result = kj::NEVER_DONE;
    ++inFlight;
    return result.attach(kj::defer([this]() {
      if (--inFlight == 0) {
        KJ_IF_SOME(f, onCancelFulfiller) {
          f->fulfill();
        }
      }
    }));
  }